

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::AuxNoReg(ByteCodeWriter *this,OpCode op,uint byteOffset,int C1)

{
  code *pcVar1;
  int32 iVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  int32 local_24;
  uint32 local_20;
  OpLayoutAuxNoReg data;
  int C1_local;
  uint byteOffset_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  data.Offset = C1;
  data.C1 = byteOffset;
  CheckOpen(this);
  iVar2 = data.C1;
  uVar4 = Data::GetCurrentOffset(&this->m_auxiliaryData);
  if (uVar4 <= (uint)iVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x9c3,"(byteOffset < m_auxiliaryData.GetCurrentOffset())",
                                "byteOffset < m_auxiliaryData.GetCurrentOffset()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  local_24 = data.C1;
  local_20 = data.Offset;
  Data::Encode(&this->m_byteCodeData,op,&local_24,8,this);
  return;
}

Assistant:

void ByteCodeWriter::AuxNoReg(OpCode op, uint byteOffset, int C1)
    {
        CheckOpen();

        //
        // Write the buffer's contents
        //

        Assert(byteOffset < m_auxiliaryData.GetCurrentOffset());

        OpLayoutAuxNoReg data;
        data.Offset = byteOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }